

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_39e9f3::Handlers::beginPagesArray(Handlers *this,JSON param_1)

{
  __shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  QPDFJob::Config::pages((Config *)&local_20);
  std::__shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void
Handlers::beginPagesArray(JSON)
{
    this->c_pages = c_main->pages();
}